

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

void pq_unlink_common(PacketQueueBase *pqb,PacketQueueNode *node)

{
  PacketQueueNode *node_local;
  PacketQueueBase *pqb_local;
  
  node->next->prev = node->prev;
  node->prev->next = node->next;
  if (pqb->total_size < node->formal_size) {
    __assert_fail("pqb->total_size >= node->formal_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/common.c",
                  0x56,"void pq_unlink_common(PacketQueueBase *, PacketQueueNode *)");
  }
  pqb->total_size = pqb->total_size - node->formal_size;
  if (((PacketQueueBase *)(pqb->end).next == pqb) && (pqb->total_size != 0)) {
    __assert_fail("pqb->end.next != &pqb->end || pqb->total_size == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/common.c",
                  0x5c,"void pq_unlink_common(PacketQueueBase *, PacketQueueNode *)");
  }
  return;
}

Assistant:

static inline void pq_unlink_common(PacketQueueBase *pqb,
                                    PacketQueueNode *node)
{
    node->next->prev = node->prev;
    node->prev->next = node->next;

    /* Check total_size doesn't drift out of sync downwards, by
     * ensuring it doesn't underflow when we do this subtraction */
    assert(pqb->total_size >= node->formal_size);
    pqb->total_size -= node->formal_size;

    /* Check total_size doesn't drift out of sync upwards, by checking
     * that it's returned to exactly zero whenever a queue is
     * emptied */
    assert(pqb->end.next != &pqb->end || pqb->total_size == 0);
}